

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayKernel.hh
# Opt level: O0

void __thiscall OpenMesh::ArrayKernel::request_edge_status(ArrayKernel *this)

{
  uint uVar1;
  allocator local_31;
  string local_30 [32];
  ArrayKernel *local_10;
  ArrayKernel *this_local;
  
  uVar1 = this->refcount_estatus_;
  this->refcount_estatus_ = uVar1 + 1;
  if (uVar1 == 0) {
    local_10 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"e:status",&local_31);
    BaseKernel::add_property<OpenMesh::Attributes::StatusInfo>
              (&this->super_BaseKernel,&this->edge_status_,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void request_edge_status()
  {
    if (!refcount_estatus_++)
      add_property( edge_status_, "e:status" );
  }